

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationIterator::getCE32FromPrefix
          (CollationIterator *this,CollationData *d,uint32_t ce32,UErrorCode *errorCode)

{
  UChar *pUVar1;
  int cp;
  UStringTrieResult UVar2;
  uint32_t uVar3;
  uint uVar4;
  UCharsTrie prefixes;
  UCharsTrie local_50;
  
  pUVar1 = d->contexts + (ce32 >> 0xd);
  local_50.uchars_ = pUVar1 + 2;
  local_50.ownedArray_ = (char16_t *)0x0;
  local_50.remainingMatchLength_ = -1;
  uVar3 = CONCAT22(*pUVar1,pUVar1[1]);
  uVar4 = 0;
  local_50.pos_ = local_50.uchars_;
  do {
    cp = (*(this->super_UObject)._vptr_UObject[7])(this,errorCode);
    if (cp < 0) break;
    UVar2 = UCharsTrie::nextForCodePoint(&local_50,cp);
    if (1 < (int)UVar2) {
      uVar3 = UCharsTrie::getValue(&local_50);
    }
    uVar4 = uVar4 + 1;
  } while ((UVar2 & USTRINGTRIE_NO_VALUE) != USTRINGTRIE_NO_MATCH);
  (*(this->super_UObject)._vptr_UObject[0xc])(this,(ulong)uVar4,errorCode);
  UCharsTrie::~UCharsTrie(&local_50);
  return uVar3;
}

Assistant:

uint32_t
CollationIterator::getCE32FromPrefix(const CollationData *d, uint32_t ce32,
                                     UErrorCode &errorCode) {
    const UChar *p = d->contexts + Collation::indexFromCE32(ce32);
    ce32 = CollationData::readCE32(p);  // Default if no prefix match.
    p += 2;
    // Number of code points read before the original code point.
    int32_t lookBehind = 0;
    UCharsTrie prefixes(p);
    for(;;) {
        UChar32 c = previousCodePoint(errorCode);
        if(c < 0) { break; }
        ++lookBehind;
        UStringTrieResult match = prefixes.nextForCodePoint(c);
        if(USTRINGTRIE_HAS_VALUE(match)) {
            ce32 = (uint32_t)prefixes.getValue();
        }
        if(!USTRINGTRIE_HAS_NEXT(match)) { break; }
    }
    forwardNumCodePoints(lookBehind, errorCode);
    return ce32;
}